

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_RequiredOptsDoubleNeg_Test::~TApp_RequiredOptsDoubleNeg_Test
          (TApp_RequiredOptsDoubleNeg_Test *this)

{
  TApp_RequiredOptsDoubleNeg_Test *this_local;
  
  ~TApp_RequiredOptsDoubleNeg_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiredOptsDoubleNeg) {
    std::vector<std::string> strs;
    app.add_option("-s", strs)->required()->expected(-2);

    args = {"-s", "one"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"-s", "one", "two", "-s", "three"};

    EXPECT_NO_THROW(run());

    EXPECT_EQ(strs, std::vector<std::string>({"one", "two", "three"}));

    app.reset();
    args = {"-s", "one", "two"};

    EXPECT_NO_THROW(run());

    EXPECT_EQ(strs, std::vector<std::string>({"one", "two"}));
}